

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::MergeReturnPass::PredicateBlocks
          (MergeReturnPass *this,BasicBlock *return_block,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *predicated,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order)

{
  StructuredControlState *pSVar1;
  Instruction *this_00;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_type sVar5;
  StructuredControlState *this_01;
  __ireturn_type _Var6;
  BasicBlock *block;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *local_78;
  BasicBlock *return_block_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  seen;
  
  return_block_local = return_block;
  sVar5 = std::
          _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&predicated->_M_h,&return_block_local);
  bVar2 = true;
  if (sVar5 == 0) {
    seen._M_h._M_bucket_count = (size_type)&block;
    block = (BasicBlock *)0x0;
    seen._M_h._M_element_count =
         (size_type)
         std::
         _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:397:38)>
         ::_M_invoke;
    seen._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:397:38)>
         ::_M_manager;
    local_78 = order;
    seen._M_h._M_buckets = (__buckets_ptr)this;
    BasicBlock::ForEachSuccessorLabel(return_block_local,(function<void_(unsigned_int)> *)&seen);
    if (seen._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)seen._M_h._M_before_begin._M_nxt)(&seen,&seen,3);
    }
    if (block == (BasicBlock *)0x0) {
      __assert_fail("block && \"Return blocks should have returns already replaced by a single \" \"unconditional branch.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x194,
                    "bool spvtools::opt::MergeReturnPass::PredicateBlocks(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *)"
                   );
    }
    pSVar1 = (this->state_).
             super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    seen._M_h._M_buckets = &seen._M_h._M_single_bucket;
    seen._M_h._M_bucket_count = 1;
    seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    seen._M_h._M_element_count = 0;
    seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    seen._M_h._M_rehash_policy._M_next_resize = 0;
    seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
    uVar3 = BasicBlock::id(block);
    this_01 = pSVar1 + -1;
    uVar4 = StructuredControlState::CurrentMergeId(this_01);
    if (uVar3 != uVar4) {
      uVar3 = BasicBlock::id(block);
      uVar4 = StructuredControlState::BreakMergeId(this_01);
      this_01 = pSVar1;
      if (uVar3 == uVar4) {
        this_01 = pSVar1 + 1;
        do {
          uVar3 = StructuredControlState::BreakMergeId(this_01 + -2);
          uVar4 = BasicBlock::id(block);
          this_01 = this_01 + -1;
        } while (uVar3 == uVar4);
      }
    }
    while( true ) {
      bVar2 = true;
      if (((block == (BasicBlock *)0x0) || (block == this->final_return_block_)) ||
         (_Var6 = std::__detail::
                  _Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::insert((_Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)predicated,&block),
         ((undefined1  [16])_Var6 & (undefined1  [16])0x1) == (undefined1  [16])0x0))
      goto LAB_00220082;
      this_00 = this_01[-1].break_merge_;
      if (this_00 == (Instruction *)0x0) {
        __assert_fail("state->InBreakable() && \"Should be in the placeholder construct at the very least.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                      ,0x1a4,
                      "bool spvtools::opt::MergeReturnPass::PredicateBlocks(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *)"
                     );
      }
      uVar3 = Instruction::GetSingleWordInOperand(this_00,0);
      this_01 = this_01 + 1;
      do {
        uVar4 = StructuredControlState::BreakMergeId(this_01 + -2);
        this_01 = this_01 + -1;
      } while (uVar4 == uVar3);
      bVar2 = BreakFromConstruct(this,block,predicated,local_78,this_00);
      if (!bVar2) break;
      block = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,uVar3);
    }
    bVar2 = false;
LAB_00220082:
    std::
    _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&seen._M_h);
  }
  return bVar2;
}

Assistant:

bool MergeReturnPass::PredicateBlocks(
    BasicBlock* return_block, std::unordered_set<BasicBlock*>* predicated,
    std::list<BasicBlock*>* order) {
  // The CFG is being modified as the function proceeds so avoid caching
  // successors.

  if (predicated->count(return_block)) {
    return true;
  }

  BasicBlock* block = nullptr;
  const BasicBlock* const_block = const_cast<const BasicBlock*>(return_block);
  const_block->ForEachSuccessorLabel([this, &block](const uint32_t idx) {
    BasicBlock* succ_block = context()->get_instr_block(idx);
    assert(block == nullptr);
    block = succ_block;
  });
  assert(block &&
         "Return blocks should have returns already replaced by a single "
         "unconditional branch.");

  auto state = state_.rbegin();
  std::unordered_set<BasicBlock*> seen;
  if (block->id() == state->CurrentMergeId()) {
    state++;
  } else if (block->id() == state->BreakMergeId()) {
    while (state->BreakMergeId() == block->id()) {
      state++;
    }
  }

  while (block != nullptr && block != final_return_block_) {
    if (!predicated->insert(block).second) break;
    // Skip structured subgraphs.
    assert(state->InBreakable() &&
           "Should be in the placeholder construct at the very least.");
    Instruction* break_merge_inst = state->BreakMergeInst();
    uint32_t merge_block_id = break_merge_inst->GetSingleWordInOperand(0);
    while (state->BreakMergeId() == merge_block_id) {
      state++;
    }
    if (!BreakFromConstruct(block, predicated, order, break_merge_inst)) {
      return false;
    }
    block = context()->get_instr_block(merge_block_id);
  }
  return true;
}